

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris.c
# Opt level: O3

void with_player_do(gchar *name,WithPlayerCallback callback)

{
  gboolean gVar1;
  MediaPlayer2Player *pMVar2;
  GError *error;
  GError *local_18;
  
  local_18 = (GError *)0x0;
  pMVar2 = get_player_by_name(name,&local_18);
  if (pMVar2 != (MediaPlayer2Player *)0x0) {
    gVar1 = (*callback)(pMVar2,(GCancellable *)0x0,&local_18);
    g_object_unref(pMVar2);
    if (gVar1 != 0) {
      return;
    }
  }
  g_log(0,0x10,"%s",local_18->message);
  g_error_free(local_18);
  return;
}

Assistant:

static void
with_player_do(const gchar* name, WithPlayerCallback callback)
{
  GError* error = NULL;
  MediaPlayer2Player* player = get_player_by_name(name, &error);
  if (!player) {
    g_warning("%s", error->message);
    g_error_free(error);
    return;
  }

  gboolean result = callback(player, NULL, &error);
  g_object_unref(player);
  if (!result) {
    g_warning("%s", error->message);
    g_error_free(error);
  }
}